

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

string * underscores_to_initial_caps(string *__return_storage_ptr__,string *name)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  undefined4 local_30;
  char c;
  uint i;
  bool uppercase_next;
  char *tmp;
  string *name_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  lVar4 = std::__cxx11::string::c_str();
  bVar2 = true;
  for (local_30 = 0; uVar5 = std::__cxx11::string::length(), local_30 < uVar5;
      local_30 = local_30 + 1) {
    cVar1 = *(char *)(lVar4 + (ulong)local_30);
    if (cVar1 == '_') {
      bVar2 = true;
    }
    else if (bVar2) {
      iVar3 = toupper((int)cVar1);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar3);
      bVar2 = false;
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string underscores_to_initial_caps(string name) {
  string ret;
  const char* tmp = name.c_str();
  bool uppercase_next = true;

  for (unsigned int i = 0; i < name.length(); i++) {
    char c = tmp[i];
    if (c == '_') {
      uppercase_next = true;
    } else {
      if (uppercase_next) {
        ret += toupper(c);
        uppercase_next = false;
      } else {
        ret += c;
      }
    }
  }

  return ret;
}